

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O3

void Amap_ManCreateChoice(Amap_Man_t *p,Amap_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Amap_Obj_t *pAVar4;
  
  pObj->field_0x7 = pObj->field_0x7 | 0x40;
  uVar2 = *(uint *)&pObj->field_0x8;
  pAVar4 = pObj;
  do {
    uVar3 = *(uint *)&pAVar4->field_0x8 & 0xfff;
    if (uVar3 < (uVar2 & 0xfff)) {
      uVar3 = uVar2 & 0xfff;
    }
    uVar2 = uVar2 & 0xfffff000 | uVar3;
    *(uint *)&pObj->field_0x8 = uVar2;
    uVar1 = pAVar4->Equiv;
    if ((ulong)uVar1 == 0) break;
    if (((int)uVar1 < 0) || (p->vObjs->nSize <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pAVar4 = (Amap_Obj_t *)p->vObjs->pArray[uVar1];
  } while (pAVar4 != (Amap_Obj_t *)0x0);
  uVar2 = p->nLevelMax;
  if (p->nLevelMax < (int)uVar3) {
    p->nLevelMax = uVar3;
    uVar2 = uVar3;
  }
  if (uVar2 < 0xffe) {
    return;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapGraph.c"
                ,0xed,"void Amap_ManCreateChoice(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

void Amap_ManCreateChoice( Amap_Man_t * p, Amap_Obj_t * pObj )
{
    Amap_Obj_t * pTemp;
    // mark the node as a representative if its class
//    assert( pObj->fRepr == 0 );
    pObj->fRepr = 1;
    // update the level of this node (needed for correct required time computation)
    for ( pTemp = pObj; pTemp; pTemp = Amap_ObjChoice(p, pTemp) )
    {
        pObj->Level = Abc_MaxInt( pObj->Level, pTemp->Level );
//        pTemp->nVisits++; pTemp->nVisitsCopy++;
    }
    // mark the largest level
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
}